

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendApi.cpp
# Opt level: O2

void CheckIsExecutable(RecyclableObject *function,JavascriptMethod entrypoint)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  JavascriptFunction *pJVar7;
  undefined4 *puVar8;
  uint lineNumber;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  bVar4 = Js::VarIsImpl<Js::JavascriptFunction>(function);
  if (bVar4) {
    pJVar7 = Js::VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    iVar5 = (*(pJVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])(pJVar7);
    if (iVar5 == 0) goto LAB_003bfc6b;
  }
  else {
LAB_003bfc6b:
    bVar4 = Js::CrossSite::IsThunk(entrypoint);
    if (((!bVar4) &&
        ((((bVar4 = Js::VarIsImpl<Js::JavascriptFunction>(function), bVar4 ||
           (BVar6 = Js::RecyclableObject::IsExternal(function), BVar6 == 0)) ||
          (bVar4 = Js::JavascriptConversion::IsCallable(function), !bVar4)) &&
         (pSVar2->isScriptContextActuallyClosed == true)))) &&
       ((pSVar2->threadContext->isScriptActive != true ||
        (bVar4 = Js::JavascriptConversion::IsCallable(function), bVar4)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                         ,0x99,
                         "((Js::VarIs<Js::JavascriptFunction>(function) && Js::VarTo<Js::JavascriptFunction>(function)->IsExternalFunction()) || Js::CrossSite::IsThunk(entrypoint) || (!Js::VarIs<Js::JavascriptFunction>(function) && function->IsExternal() && Js::JavascriptConversion::IsCallable(function)) || !scriptContext->IsActuallyClosed() || (scriptContext->GetThreadContext()->IsScriptActive() && !Js::JavascriptConversion::IsCallable(function)))"
                         ,"Can\'t call function when the script context is closed");
      if (!bVar4) goto LAB_003bfeb6;
      *puVar8 = 0;
    }
  }
  if (pSVar2->threadContext->isScriptActive != false) {
    return;
  }
  BVar6 = Js::RecyclableObject::IsExternal(function);
  if (BVar6 != 0) {
    return;
  }
  TVar1 = ((function->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar6 = Js::RecyclableObject::IsExternal(function), BVar6 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/JavascriptOperators.inl"
                       ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                       "GetTypeId aValue has invalid TypeId");
    if (!bVar4) goto LAB_003bfeb6;
    *puVar8 = 0;
  }
  if (TVar1 == TypeIds_Function) {
    iVar5 = (*(function->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x6e])(function);
    if (iVar5 != 0) {
      return;
    }
    iVar5 = (*(function->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x6f])(function);
    if (iVar5 != 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    lineNumber = 0xb5;
  }
  else if (TVar1 == TypeIds_HostDispatch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    lineNumber = 0xa7;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    lineNumber = 0xba;
  }
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                     ,lineNumber,"(false)",
                     "Has to go through CallRootFunction to start calling Javascript function");
  if (bVar4) {
    *puVar8 = 0;
    return;
  }
LAB_003bfeb6:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void CheckIsExecutable(Js::RecyclableObject * function, Js::JavascriptMethod entrypoint)
{
    Js::ScriptContext * scriptContext = function->GetScriptContext();
    // it's easy to call the default entry point from RecyclableObject.
    AssertMsg((Js::VarIs<Js::JavascriptFunction>(function) && Js::VarTo<Js::JavascriptFunction>(function)->IsExternalFunction())
        || Js::CrossSite::IsThunk(entrypoint)
        // External object with entrypoint
        || (!Js::VarIs<Js::JavascriptFunction>(function)
            && function->IsExternal()
            && Js::JavascriptConversion::IsCallable(function))
        || !scriptContext->IsActuallyClosed()
        || (scriptContext->GetThreadContext()->IsScriptActive() && !Js::JavascriptConversion::IsCallable(function)),
        "Can't call function when the script context is closed");

    if (scriptContext->GetThreadContext()->IsScriptActive())
    {
        return;
    }
    if (function->IsExternal())
    {
        return;
    }

    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(function);
    if (typeId == Js::TypeIds_HostDispatch)
    {
        AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
    }
    else if (typeId == Js::TypeId::TypeIds_Function)
    {
        if (((Js::JavascriptFunction*)function)->IsExternalFunction())
        {
            return;
        }
        else if (((Js::JavascriptFunction*)function)->IsWinRTFunction())
        {
            return;
        }
        else
        {
            AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
        }
    }
    else
    {
        AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
    }
}